

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::EndDocument(cmXMLWriter *this)

{
  bool bVar1;
  cmXMLWriter *this_local;
  
  bVar1 = std::
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->Elements);
  if (!bVar1) {
    __assert_fail("this->Elements.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmXMLWriter.cxx"
                  ,0x1e,"void cmXMLWriter::EndDocument()");
  }
  std::operator<<(this->Output,'\n');
  return;
}

Assistant:

void cmXMLWriter::EndDocument()
{
  assert(this->Elements.empty());
  this->Output << '\n';
}